

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

socket_t httplib::detail::create_client_socket
                   (char *host,int port,bool tcp_nodelay,SocketOptions *socket_options,
                   time_t timeout_sec,time_t timeout_usec,string *intf,Error *error)

{
  anon_class_32_4_f0d0a25b bind_or_connect;
  socket_t sVar1;
  function<void_(int)> local_58;
  time_t tStack_30;
  socket_t sock;
  time_t timeout_usec_local;
  time_t timeout_sec_local;
  SocketOptions *socket_options_local;
  bool tcp_nodelay_local;
  char *pcStack_10;
  int port_local;
  char *host_local;
  
  tStack_30 = timeout_usec;
  timeout_usec_local = timeout_sec;
  timeout_sec_local = (time_t)socket_options;
  socket_options_local._3_1_ = tcp_nodelay;
  socket_options_local._4_4_ = port;
  pcStack_10 = host;
  std::function<void_(int)>::function(&local_58,socket_options);
  bind_or_connect.error = error;
  bind_or_connect.intf = intf;
  bind_or_connect.timeout_sec = &timeout_usec_local;
  bind_or_connect.timeout_usec = &stack0xffffffffffffffd0;
  sVar1 = create_socket<httplib::detail::create_client_socket(char_const*,int,bool,std::function<void(int)>,long,long,std::__cxx11::string_const&,httplib::Error&)::_lambda(int,addrinfo&)_1_>
                    (host,port,0,tcp_nodelay,&local_58,bind_or_connect);
  std::function<void_(int)>::~function(&local_58);
  if (sVar1 == -1) {
    if (*error == Success) {
      *error = Connection;
    }
  }
  else {
    *error = Success;
  }
  return sVar1;
}

Assistant:

inline socket_t create_client_socket(const char *host, int port,
											 bool tcp_nodelay,
											 SocketOptions socket_options,
											 time_t timeout_sec, time_t timeout_usec,
											 const std::string &intf, Error &error) {
			auto sock = create_socket(
					host, port, 0, tcp_nodelay, std::move(socket_options),
					[&](socket_t sock, struct addrinfo &ai) -> bool {
						if (!intf.empty()) {
#ifdef USE_IF2IP
							auto ip = if2ip(intf);
							if (ip.empty()) { ip = intf; }
							if (!bind_ip_address(sock, ip.c_str())) {
								error = Error::BindIPAddress;
								return false;
							}
#endif
						}

						set_nonblocking(sock, true);

						auto ret =
								::connect(sock, ai.ai_addr, static_cast<socklen_t>(ai.ai_addrlen));

						if (ret < 0) {
							if (is_connection_error() ||
								!wait_until_socket_is_ready(sock, timeout_sec, timeout_usec)) {
								close_socket(sock);
								error = Error::Connection;
								return false;
							}
						}

						set_nonblocking(sock, false);
						error = Error::Success;
						return true;
					});

			if (sock != INVALID_SOCKET) {
				error = Error::Success;
			} else {
				if (error == Error::Success) { error = Error::Connection; }
			}

			return sock;
		}